

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_sectoraction.cpp
# Opt level: O1

void __thiscall ASectorAction::Destroy(ASectorAction *this)

{
  ActorFlags *pAVar1;
  AActor **ppAVar2;
  sector_t *psVar3;
  AActor *pAVar4;
  AActor *pAVar5;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar6;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar7;
  bool bVar8;
  
  psVar3 = (this->super_AActor).Sector;
  if (psVar3 != (sector_t *)0x0) {
    pAVar4 = &((psVar3->SecActTarget).field_0.p)->super_AActor;
    if ((pAVar4 != (AActor *)0x0) &&
       (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (psVar3->SecActTarget).field_0.p = (ASectorAction *)0x0;
      pAVar4 = (AActor *)0x0;
    }
    bVar8 = pAVar4 != (AActor *)0x0;
    pAVar5 = pAVar4;
    if (pAVar4 == &this->super_AActor || pAVar4 == (AActor *)0x0) {
      paVar6 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)
               &((this->super_AActor).Sector)->SecActTarget;
    }
    else {
      do {
        pAVar4 = (pAVar5->tracer).field_0.p;
        paVar6 = &(pAVar5->tracer).field_0;
        if ((pAVar4 != (AActor *)0x0) &&
           (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (((TObjPtr<AActor> *)paVar6)->field_0).p = (AActor *)0x0;
          pAVar4 = (AActor *)0x0;
        }
        bVar8 = pAVar4 != (AActor *)0x0;
      } while ((bVar8) && (pAVar5 = pAVar4, pAVar4 != &this->super_AActor));
    }
    if (bVar8) {
      aVar7 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)(pAVar4->tracer).field_0.p;
      if ((aVar7.p != (AActor *)0x0) &&
         ((((aVar7.p)->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (pAVar4->tracer).field_0.p = (AActor *)0x0;
        aVar7.p = (AActor *)0x0;
      }
      paVar6->p = (AActor *)aVar7;
    }
    (this->super_AActor).Sector = (sector_t *)0x0;
    AActor::Destroy(&this->super_AActor);
    return;
  }
  AActor::ClearRenderSectorList(&this->super_AActor);
  AActor::ClearRenderLineList(&this->super_AActor);
  AActor::DestroyAllInventory(&this->super_AActor);
  if (((this->super_AActor).tid != 0) &&
     (ppAVar2 = (this->super_AActor).iprev, ppAVar2 != (AActor **)0x0)) {
    *ppAVar2 = (this->super_AActor).inext;
    pAVar4 = (this->super_AActor).inext;
    if (pAVar4 != (AActor *)0x0) {
      pAVar4->iprev = (this->super_AActor).iprev;
    }
    (this->super_AActor).inext = (AActor *)0x0;
    (this->super_AActor).iprev = (AActor **)0x0;
  }
  (this->super_AActor).tid = 0;
  AActor::UnlinkFromWorld(&this->super_AActor,(FLinkContext *)0x0);
  pAVar1 = &(this->super_AActor).flags;
  *(byte *)&pAVar1->Value = (byte)pAVar1->Value | 0x18;
  S_RelinkSound(&this->super_AActor,(AActor *)0x0);
  DThinker::Destroy((DThinker *)this);
  return;
}

Assistant:

void ASectorAction::Destroy ()
{
	if (Sector != nullptr)
	{
		// Remove ourself from this sector's list of actions
		AActor *probe = Sector->SecActTarget;
		union
		{
			AActor **act;
			ASectorAction **secact;
		} prev;
		prev.secact = &Sector->SecActTarget;

		while (probe && probe != this)
		{
			prev.act = &probe->tracer;
			probe = probe->tracer;
		}
		if (probe != nullptr)
		{
			*prev.act = probe->tracer;
		}
		Sector = nullptr;
	}

	Super::Destroy ();
}